

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void __thiscall
embree::sse42::
BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::InstanceIntersectorK<4>_>,_false>
::intersect(BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::InstanceIntersectorK<4>_>,_false>
            *this,vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,RayQueryContext *context)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  RayQueryContext *pRVar3;
  undefined1 auVar4 [16];
  int iVar5;
  uint uVar6;
  size_t bits;
  ulong uVar7;
  ulong extraout_RAX;
  uint i;
  long lVar8;
  NodeRef *pNVar9;
  undefined4 uVar10;
  int iVar11;
  NodeRef nodeRef;
  RayQueryContext *pRVar12;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar13;
  RayQueryContext *pRVar14;
  bool bVar15;
  float fVar16;
  float fVar25;
  float fVar26;
  vint4 bi;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar27 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar28;
  float fVar29;
  float fVar34;
  float fVar35;
  vint4 bi_1;
  float fVar36;
  undefined1 auVar30 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar37;
  float fVar39;
  float fVar40;
  vint4 ai;
  float fVar41;
  undefined1 auVar38 [16];
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  vint4 ai_1;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar52;
  float fVar53;
  vint4 ai_3;
  undefined1 auVar51 [16];
  float fVar54;
  uint uVar56;
  uint uVar57;
  vint4 bi_2;
  uint uVar58;
  undefined1 auVar55 [16];
  float fVar59;
  float fVar61;
  float fVar62;
  vint4 bi_3;
  undefined1 auVar60 [16];
  uint uVar63;
  float fVar66;
  uint uVar67;
  uint uVar68;
  vint4 ai_2;
  float fVar69;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  uint uVar70;
  float fVar71;
  int iVar72;
  int iVar73;
  float fVar74;
  int iVar75;
  float fVar76;
  float fVar79;
  float fVar80;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar81;
  float fVar82;
  float fVar84;
  float fVar85;
  undefined1 auVar83 [16];
  float fVar86;
  float fVar87;
  float fVar89;
  float fVar90;
  undefined1 in_XMM12 [16];
  undefined1 auVar88 [16];
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  undefined1 in_XMM13 [16];
  float fVar95;
  float fVar96;
  float fVar97;
  Precalculations pre;
  vint4 bi_8;
  vbool<4> valid_leaf;
  undefined1 local_1758 [16];
  float local_1748;
  float fStack_1744;
  float fStack_1740;
  float fStack_173c;
  float local_1738;
  float fStack_1734;
  float fStack_1730;
  float fStack_172c;
  float local_1728;
  float fStack_1724;
  float fStack_1720;
  float fStack_171c;
  float local_1718;
  float fStack_1714;
  float fStack_1710;
  float fStack_170c;
  float local_1708;
  float fStack_1704;
  float fStack_1700;
  float fStack_16fc;
  float local_16f8;
  float fStack_16f4;
  float fStack_16f0;
  float fStack_16ec;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_16e8;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  lVar8 = (valid_i->field_0).v[0];
  pRVar14 = *(RayQueryContext **)(lVar8 + 0x70);
  if (pRVar14 != (RayQueryContext *)0x8) {
    if ((*(long *)(ray + 8) != 0) &&
       (lVar8 = *(long *)(ray + 0x10), (*(byte *)(lVar8 + 2) & 1) != 0)) {
      intersectCoherent((vint<4> *)this,(Intersectors *)valid_i,(RayHitK<4> *)This,
                        (RayQueryContext *)ray);
      return;
    }
    auVar23._8_4_ = 0xffffffff;
    auVar23._0_8_ = 0xffffffffffffffff;
    auVar23._12_4_ = 0xffffffff;
    auVar65._0_4_ = -(uint)(*(int *)this == -1);
    auVar65._4_4_ = -(uint)(*(int *)(this + 4) == -1);
    auVar65._8_4_ = -(uint)(*(int *)(this + 8) == -1);
    auVar65._12_4_ = -(uint)(*(int *)(this + 0xc) == -1);
    iVar5 = movmskps((int)lVar8,auVar65);
    uVar7 = CONCAT44((int)((ulong)lVar8 >> 0x20),iVar5);
    if (iVar5 != 0) {
      auVar22._0_8_ = (This->intersector4).intersect;
      auVar22._8_8_ = (This->intersector4).occluded;
      fVar66 = (float)((ulong)auVar22._0_8_ >> 0x20);
      fVar69 = (float)((ulong)auVar22._8_8_ >> 0x20);
      fVar42 = (float)DAT_01f80d30;
      fVar44 = DAT_01f80d30._4_4_;
      fVar46 = DAT_01f80d30._8_4_;
      fVar48 = DAT_01f80d30._12_4_;
      auVar51._4_4_ = -(uint)(ABS(fVar66) < fVar44);
      auVar51._0_4_ = -(uint)(ABS((float)auVar22._0_8_) < fVar42);
      auVar51._8_4_ = -(uint)(ABS((float)auVar22._8_8_) < fVar46);
      auVar51._12_4_ = -(uint)(ABS(fVar69) < fVar48);
      auVar51 = blendvps(auVar22,_DAT_01f80d30,auVar51);
      auVar1 = *(undefined1 (*) [16])&(This->intersector4).name;
      auVar83._4_4_ = -(uint)(ABS(auVar1._4_4_) < fVar44);
      auVar83._0_4_ = -(uint)(ABS(auVar1._0_4_) < fVar42);
      auVar83._8_4_ = -(uint)(ABS(auVar1._8_4_) < fVar46);
      auVar83._12_4_ = -(uint)(ABS(auVar1._12_4_) < fVar48);
      auVar77 = blendvps(auVar1,_DAT_01f80d30,auVar83);
      auVar2._0_8_ = (This->intersector4_filter).occluded;
      auVar2._8_8_ = (This->intersector4_filter).name;
      fVar71 = (float)((ulong)auVar2._0_8_ >> 0x20);
      fVar74 = (float)((ulong)auVar2._8_8_ >> 0x20);
      auVar88._4_4_ = -(uint)(ABS(fVar71) < fVar44);
      auVar88._0_4_ = -(uint)(ABS((float)auVar2._0_8_) < fVar42);
      auVar88._8_4_ = -(uint)(ABS((float)auVar2._8_8_) < fVar46);
      auVar88._12_4_ = -(uint)(ABS(fVar74) < fVar48);
      auVar83 = blendvps(auVar2,_DAT_01f80d30,auVar88);
      auVar88 = rcpps(in_XMM12,auVar51);
      fVar87 = auVar88._0_4_;
      fVar89 = auVar88._4_4_;
      fVar90 = auVar88._8_4_;
      fVar91 = auVar88._12_4_;
      auVar88 = rcpps(in_XMM13,auVar77);
      fVar92 = auVar88._0_4_;
      auVar78._0_4_ = auVar77._0_4_ * fVar92;
      fVar93 = auVar88._4_4_;
      auVar78._4_4_ = auVar77._4_4_ * fVar93;
      fVar94 = auVar88._8_4_;
      auVar78._8_4_ = auVar77._8_4_ * fVar94;
      fVar95 = auVar88._12_4_;
      auVar78._12_4_ = auVar77._12_4_ * fVar95;
      auVar77 = rcpps(auVar78,auVar83);
      fVar76 = auVar77._0_4_;
      fVar79 = auVar77._4_4_;
      fVar80 = auVar77._8_4_;
      fVar81 = auVar77._12_4_;
      auVar64._0_8_ =
           CONCAT44(-(uint)(fVar66 < 0.0),-(uint)((float)auVar22._0_8_ < 0.0)) & 0x100000001;
      auVar64._8_4_ = -(uint)((float)auVar22._8_8_ < 0.0) & 1;
      auVar64._12_4_ = -(uint)(fVar69 < 0.0) & 1;
      auVar60._0_8_ =
           CONCAT44(-(uint)(auVar1._4_4_ < 0.0),-(uint)(auVar1._0_4_ < 0.0)) & 0x200000002;
      auVar60._8_4_ = -(uint)(auVar1._8_4_ < 0.0) & 2;
      auVar60._12_4_ = -(uint)(auVar1._12_4_ < 0.0) & 2;
      fVar82 = *(float *)&This->ptr;
      fVar84 = *(float *)((long)&This->ptr + 4);
      fVar85 = *(float *)&This->leafIntersector;
      fVar86 = *(float *)((long)&This->leafIntersector + 4);
      fVar42 = *(float *)&(This->collider).collide;
      fVar44 = *(float *)((long)&(This->collider).collide + 4);
      fVar46 = *(float *)&(This->collider).name;
      fVar48 = *(float *)((long)&(This->collider).name + 4);
      fVar66 = *(float *)&(This->intersector1).intersect;
      fVar69 = *(float *)((long)&(This->intersector1).intersect + 4);
      fVar96 = *(float *)&(This->intersector1).occluded;
      fVar97 = *(float *)((long)&(This->intersector1).occluded + 4);
      auVar77._8_4_ = -(uint)((float)auVar2._8_8_ < 0.0) & 4;
      auVar77._0_8_ =
           CONCAT44(-(uint)(fVar71 < 0.0),-(uint)((float)auVar2._0_8_ < 0.0)) & 0x400000004;
      auVar77._12_4_ = -(uint)(fVar74 < 0.0) & 4;
      auVar1._0_8_ = (This->intersector1).pointQuery;
      auVar1._8_8_ = (This->intersector1).name;
      local_1758 = auVar65 ^ auVar23 | auVar77 | auVar60 | auVar64;
      do {
        lVar8 = 0;
        if (uVar7 != 0) {
          for (; (uVar7 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
          }
        }
        iVar5 = *(int *)(local_1758 + lVar8 * 4);
        auVar17._0_4_ = -(uint)(iVar5 == local_1758._0_4_);
        auVar17._4_4_ = -(uint)(iVar5 == local_1758._4_4_);
        auVar17._8_4_ = -(uint)(iVar5 == local_1758._8_4_);
        auVar17._12_4_ = -(uint)(iVar5 == local_1758._12_4_);
        uVar10 = movmskps((int)lVar8,auVar17);
        uVar7 = uVar7 & ~CONCAT44((int)((ulong)lVar8 >> 0x20),uVar10);
      } while (uVar7 != 0);
      auVar27._0_4_ = -(uint)(*(int *)this == -1);
      auVar27._4_4_ = -(uint)(*(int *)(this + 4) == -1);
      auVar27._8_4_ = -(uint)(*(int *)(this + 8) == -1);
      auVar27._12_4_ = -(uint)(*(int *)(this + 0xc) == -1);
      auVar65 = maxps(auVar1,ZEXT816(0));
      iVar5 = (int)DAT_01f7a9f0;
      iVar72 = DAT_01f7a9f0._4_4_;
      iVar73 = DAT_01f7a9f0._8_4_;
      iVar75 = DAT_01f7a9f0._12_4_;
      local_16e8.v = (__m128)blendvps(_DAT_01f7a9f0,auVar65,auVar27);
      local_1758._8_4_ = 0xffffffff;
      local_1758._0_8_ = 0xffffffffffffffff;
      local_1758._12_4_ = 0xffffffff;
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_near[0].field_0 = _DAT_01f7a9f0;
      stack_node[1].ptr = (size_t)pRVar14;
      stack_near[1].field_0 = local_16e8;
      if (pRVar14 != (RayQueryContext *)&DAT_fffffffffffffff8) {
        fVar87 = fVar87 + (1.0 - auVar51._0_4_ * fVar87) * fVar87;
        fVar89 = fVar89 + (1.0 - auVar51._4_4_ * fVar89) * fVar89;
        fVar90 = fVar90 + (1.0 - auVar51._8_4_ * fVar90) * fVar90;
        fVar91 = fVar91 + (1.0 - auVar51._12_4_ * fVar91) * fVar91;
        fVar92 = fVar92 + (1.0 - auVar78._0_4_) * fVar92;
        fVar93 = fVar93 + (1.0 - auVar78._4_4_) * fVar93;
        fVar94 = fVar94 + (1.0 - auVar78._8_4_) * fVar94;
        fVar95 = fVar95 + (1.0 - auVar78._12_4_) * fVar95;
        fVar76 = fVar76 + (1.0 - auVar83._0_4_ * fVar76) * fVar76;
        fVar79 = fVar79 + (1.0 - auVar83._4_4_ * fVar79) * fVar79;
        fVar80 = fVar80 + (1.0 - auVar83._8_4_ * fVar80) * fVar80;
        fVar81 = fVar81 + (1.0 - auVar83._12_4_ * fVar81) * fVar81;
        pNVar9 = stack_node + 1;
        auVar65 = maxps(*(undefined1 (*) [16])&(This->intersector4_nofilter).name,_DAT_01f7aa10);
        bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                       blendvps(_DAT_01f7aa00,auVar65,auVar27);
        paVar13 = &stack_near[2].field_0;
        local_16f8 = fVar87;
        fStack_16f4 = fVar89;
        fStack_16f0 = fVar90;
        fStack_16ec = fVar91;
        local_1708 = fVar92;
        fStack_1704 = fVar93;
        fStack_1700 = fVar94;
        fStack_16fc = fVar95;
        local_1718 = fVar76;
        fStack_1714 = fVar79;
        fStack_1710 = fVar80;
        fStack_170c = fVar81;
        local_1728 = fVar82;
        fStack_1724 = fVar84;
        fStack_1720 = fVar85;
        fStack_171c = fVar86;
        local_1738 = fVar42;
        fStack_1734 = fVar44;
        fStack_1730 = fVar46;
        fStack_172c = fVar48;
        local_1748 = fVar66;
        fStack_1744 = fVar69;
        fStack_1740 = fVar96;
        fStack_173c = fVar97;
        uVar7 = 0;
        do {
          aVar31 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar13[-1].v;
          paVar13 = paVar13 + -1;
          auVar18._4_4_ = -(uint)(aVar31.v[1] < (float)bi_8.field_0.i[1]);
          auVar18._0_4_ = -(uint)(aVar31.v[0] < (float)bi_8.field_0.i[0]);
          auVar18._8_4_ = -(uint)(aVar31.v[2] < (float)bi_8.field_0.i[2]);
          auVar18._12_4_ = -(uint)(aVar31._12_4_ < (float)bi_8.field_0.i[3]);
          uVar6 = movmskps((int)uVar7,auVar18);
          uVar7 = (ulong)uVar6;
          if (uVar6 != 0) {
            while (((ulong)pRVar14 & 8) == 0) {
              lVar8 = 0;
              uVar7 = 0;
              aVar28.i[1] = iVar72;
              aVar28.i[0] = iVar5;
              aVar28.i[2] = iVar73;
              aVar28.i[3] = iVar75;
              pRVar12 = (RayQueryContext *)0x8;
              do {
                pRVar3 = *(RayQueryContext **)(((ulong)pRVar14 & 0xfffffffffffffff0) + lVar8 * 8);
                aVar31 = aVar28;
                if (pRVar3 == (RayQueryContext *)0x8) break;
                fVar71 = *(float *)((long)&pRVar14[1].user + lVar8 * 4);
                fVar74 = *(float *)((long)&pRVar14[2].scene + lVar8 * 4);
                fVar16 = *(float *)((long)&pRVar14[2].args + lVar8 * 4);
                fVar36 = *(float *)((long)&pRVar14[3].user + lVar8 * 4);
                fVar37 = (fVar71 - fVar82) * fVar87;
                fVar39 = (fVar71 - fVar84) * fVar89;
                fVar40 = (fVar71 - fVar85) * fVar90;
                fVar41 = (fVar71 - fVar86) * fVar91;
                fVar43 = (fVar16 - fVar42) * fVar92;
                fVar45 = (fVar16 - fVar44) * fVar93;
                fVar47 = (fVar16 - fVar46) * fVar94;
                fVar49 = (fVar16 - fVar48) * fVar95;
                fVar71 = *(float *)((long)&pRVar14[4].scene + lVar8 * 4);
                fVar50 = (fVar71 - fVar66) * fVar76;
                fVar52 = (fVar71 - fVar69) * fVar79;
                fVar53 = (fVar71 - fVar96) * fVar80;
                fVar54 = (fVar71 - fVar97) * fVar81;
                fVar16 = (fVar74 - fVar82) * fVar87;
                fVar25 = (fVar74 - fVar84) * fVar89;
                fVar26 = (fVar74 - fVar85) * fVar90;
                fVar74 = (fVar74 - fVar86) * fVar91;
                fVar29 = (fVar36 - fVar42) * fVar92;
                fVar34 = (fVar36 - fVar44) * fVar93;
                fVar35 = (fVar36 - fVar46) * fVar94;
                fVar36 = (fVar36 - fVar48) * fVar95;
                fVar71 = *(float *)((long)&pRVar14[4].args + lVar8 * 4);
                fVar59 = (fVar71 - fVar66) * fVar76;
                fVar61 = (fVar71 - fVar69) * fVar79;
                fVar62 = (fVar71 - fVar96) * fVar80;
                fVar71 = (fVar71 - fVar97) * fVar81;
                uVar6 = (uint)((int)fVar16 < (int)fVar37) * (int)fVar16 |
                        (uint)((int)fVar16 >= (int)fVar37) * (int)fVar37;
                uVar56 = (uint)((int)fVar25 < (int)fVar39) * (int)fVar25 |
                         (uint)((int)fVar25 >= (int)fVar39) * (int)fVar39;
                uVar57 = (uint)((int)fVar26 < (int)fVar40) * (int)fVar26 |
                         (uint)((int)fVar26 >= (int)fVar40) * (int)fVar40;
                uVar58 = (uint)((int)fVar74 < (int)fVar41) * (int)fVar74 |
                         (uint)((int)fVar74 >= (int)fVar41) * (int)fVar41;
                uVar63 = (uint)((int)fVar29 < (int)fVar43) * (int)fVar29 |
                         (uint)((int)fVar29 >= (int)fVar43) * (int)fVar43;
                uVar67 = (uint)((int)fVar34 < (int)fVar45) * (int)fVar34 |
                         (uint)((int)fVar34 >= (int)fVar45) * (int)fVar45;
                uVar68 = (uint)((int)fVar35 < (int)fVar47) * (int)fVar35 |
                         (uint)((int)fVar35 >= (int)fVar47) * (int)fVar47;
                uVar70 = (uint)((int)fVar36 < (int)fVar49) * (int)fVar36 |
                         (uint)((int)fVar36 >= (int)fVar49) * (int)fVar49;
                uVar63 = ((int)uVar63 < (int)uVar6) * uVar6 | ((int)uVar63 >= (int)uVar6) * uVar63;
                uVar67 = ((int)uVar67 < (int)uVar56) * uVar56 |
                         ((int)uVar67 >= (int)uVar56) * uVar67;
                uVar68 = ((int)uVar68 < (int)uVar57) * uVar57 |
                         ((int)uVar68 >= (int)uVar57) * uVar68;
                uVar70 = ((int)uVar70 < (int)uVar58) * uVar58 |
                         ((int)uVar70 >= (int)uVar58) * uVar70;
                uVar6 = (uint)((int)fVar59 < (int)fVar50) * (int)fVar59 |
                        (uint)((int)fVar59 >= (int)fVar50) * (int)fVar50;
                uVar56 = (uint)((int)fVar61 < (int)fVar52) * (int)fVar61 |
                         (uint)((int)fVar61 >= (int)fVar52) * (int)fVar52;
                uVar57 = (uint)((int)fVar62 < (int)fVar53) * (int)fVar62 |
                         (uint)((int)fVar62 >= (int)fVar53) * (int)fVar53;
                uVar58 = (uint)((int)fVar71 < (int)fVar54) * (int)fVar71 |
                         (uint)((int)fVar71 >= (int)fVar54) * (int)fVar54;
                auVar55._0_4_ =
                     ((int)uVar6 < (int)uVar63) * uVar63 | ((int)uVar6 >= (int)uVar63) * uVar6;
                auVar55._4_4_ =
                     ((int)uVar56 < (int)uVar67) * uVar67 | ((int)uVar56 >= (int)uVar67) * uVar56;
                auVar55._8_4_ =
                     ((int)uVar57 < (int)uVar68) * uVar68 | ((int)uVar57 >= (int)uVar68) * uVar57;
                auVar55._12_4_ =
                     ((int)uVar58 < (int)uVar70) * uVar70 | ((int)uVar58 >= (int)uVar70) * uVar58;
                uVar6 = (uint)((int)fVar16 < (int)fVar37) * (int)fVar37 |
                        (uint)((int)fVar16 >= (int)fVar37) * (int)fVar16;
                uVar56 = (uint)((int)fVar25 < (int)fVar39) * (int)fVar39 |
                         (uint)((int)fVar25 >= (int)fVar39) * (int)fVar25;
                uVar57 = (uint)((int)fVar26 < (int)fVar40) * (int)fVar40 |
                         (uint)((int)fVar26 >= (int)fVar40) * (int)fVar26;
                uVar58 = (uint)((int)fVar74 < (int)fVar41) * (int)fVar41 |
                         (uint)((int)fVar74 >= (int)fVar41) * (int)fVar74;
                uVar63 = (uint)((int)fVar29 < (int)fVar43) * (int)fVar43 |
                         (uint)((int)fVar29 >= (int)fVar43) * (int)fVar29;
                uVar67 = (uint)((int)fVar34 < (int)fVar45) * (int)fVar45 |
                         (uint)((int)fVar34 >= (int)fVar45) * (int)fVar34;
                uVar68 = (uint)((int)fVar35 < (int)fVar47) * (int)fVar47 |
                         (uint)((int)fVar35 >= (int)fVar47) * (int)fVar35;
                uVar70 = (uint)((int)fVar36 < (int)fVar49) * (int)fVar49 |
                         (uint)((int)fVar36 >= (int)fVar49) * (int)fVar36;
                uVar6 = ((int)uVar6 < (int)uVar63) * uVar6 | ((int)uVar6 >= (int)uVar63) * uVar63;
                uVar56 = ((int)uVar56 < (int)uVar67) * uVar56 |
                         ((int)uVar56 >= (int)uVar67) * uVar67;
                uVar57 = ((int)uVar57 < (int)uVar68) * uVar57 |
                         ((int)uVar57 >= (int)uVar68) * uVar68;
                uVar58 = ((int)uVar58 < (int)uVar70) * uVar58 |
                         ((int)uVar58 >= (int)uVar70) * uVar70;
                uVar63 = (uint)((int)fVar59 < (int)fVar50) * (int)fVar50 |
                         (uint)((int)fVar59 >= (int)fVar50) * (int)fVar59;
                uVar67 = (uint)((int)fVar61 < (int)fVar52) * (int)fVar52 |
                         (uint)((int)fVar61 >= (int)fVar52) * (int)fVar61;
                uVar68 = (uint)((int)fVar62 < (int)fVar53) * (int)fVar53 |
                         (uint)((int)fVar62 >= (int)fVar53) * (int)fVar62;
                uVar70 = (uint)((int)fVar71 < (int)fVar54) * (int)fVar54 |
                         (uint)((int)fVar71 >= (int)fVar54) * (int)fVar71;
                uVar63 = (uint)(bi_8.field_0.i[0] < (int)uVar63) * bi_8.field_0.i[0] |
                         (bi_8.field_0.i[0] >= (int)uVar63) * uVar63;
                uVar67 = (uint)(bi_8.field_0.i[1] < (int)uVar67) * bi_8.field_0.i[1] |
                         (bi_8.field_0.i[1] >= (int)uVar67) * uVar67;
                uVar68 = (uint)(bi_8.field_0.i[2] < (int)uVar68) * bi_8.field_0.i[2] |
                         (bi_8.field_0.i[2] >= (int)uVar68) * uVar68;
                uVar70 = (uint)(bi_8.field_0.i[3] < (int)uVar70) * bi_8.field_0.i[3] |
                         (bi_8.field_0.i[3] >= (int)uVar70) * uVar70;
                auVar19._4_4_ =
                     -(uint)((float)((uint)((int)auVar55._4_4_ < (int)local_16e8._4_4_) *
                                     local_16e8._4_4_ |
                                    ((int)auVar55._4_4_ >= (int)local_16e8._4_4_) * auVar55._4_4_)
                            <= (float)(((int)uVar56 < (int)uVar67) * uVar56 |
                                      ((int)uVar56 >= (int)uVar67) * uVar67));
                auVar19._0_4_ =
                     -(uint)((float)((uint)((int)auVar55._0_4_ < (int)local_16e8._0_4_) *
                                     local_16e8._0_4_ |
                                    ((int)auVar55._0_4_ >= (int)local_16e8._0_4_) * auVar55._0_4_)
                            <= (float)(((int)uVar6 < (int)uVar63) * uVar6 |
                                      ((int)uVar6 >= (int)uVar63) * uVar63));
                auVar19._8_4_ =
                     -(uint)((float)((uint)((int)auVar55._8_4_ < (int)local_16e8._8_4_) *
                                     local_16e8._8_4_ |
                                    ((int)auVar55._8_4_ >= (int)local_16e8._8_4_) * auVar55._8_4_)
                            <= (float)(((int)uVar57 < (int)uVar68) * uVar57 |
                                      ((int)uVar57 >= (int)uVar68) * uVar68));
                auVar19._12_4_ =
                     -(uint)((float)((uint)((int)auVar55._12_4_ < (int)local_16e8._12_4_) *
                                     local_16e8._12_4_ |
                                    ((int)auVar55._12_4_ >= (int)local_16e8._12_4_) * auVar55._12_4_
                                    ) <=
                            (float)(((int)uVar58 < (int)uVar70) * uVar58 |
                                   ((int)uVar58 >= (int)uVar70) * uVar70));
                uVar6 = movmskps((int)context,auVar19);
                context = (RayQueryContext *)(ulong)uVar6;
                if (uVar6 != 0) {
                  auVar30._4_4_ = iVar72;
                  auVar30._0_4_ = iVar5;
                  auVar30._8_4_ = iVar73;
                  auVar30._12_4_ = iVar75;
                  aVar31 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                           blendvps(auVar30,auVar55,auVar19);
                  auVar20._4_4_ = -(uint)(aVar31.v[1] < aVar28.v[1]);
                  auVar20._0_4_ = -(uint)(aVar31.v[0] < aVar28.v[0]);
                  auVar20._8_4_ = -(uint)(aVar31.v[2] < aVar28.v[2]);
                  auVar20._12_4_ = -(uint)(aVar31.v[3] < aVar28.v[3]);
                  iVar11 = movmskps(uVar6,auVar20);
                  context = pRVar3;
                  aVar21 = aVar31;
                  if ((iVar11 == 0) ||
                     (bVar15 = pRVar12 != (RayQueryContext *)0x8, context = pRVar12,
                     pRVar12 = pRVar3, aVar21 = aVar28, aVar28 = aVar31, bVar15)) {
                    aVar31 = aVar28;
                    uVar7 = uVar7 + 1;
                    pNVar9->ptr = (size_t)context;
                    pNVar9 = pNVar9 + 1;
                    *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar13->v = aVar21;
                    paVar13 = paVar13 + 1;
                  }
                }
                lVar8 = lVar8 + 1;
                aVar28 = aVar31;
              } while (lVar8 != 4);
              if (pRVar12 == (RayQueryContext *)0x8) goto LAB_00242626;
              pRVar14 = pRVar12;
              if (1 < uVar7) {
                auVar65 = *(undefined1 (*) [16])paVar13[-2].v;
                auVar23 = *(undefined1 (*) [16])paVar13[-1].v;
                auVar32._4_4_ = -(uint)(auVar65._4_4_ < auVar23._4_4_);
                auVar32._0_4_ = -(uint)(auVar65._0_4_ < auVar23._0_4_);
                auVar32._8_4_ = -(uint)(auVar65._8_4_ < auVar23._8_4_);
                auVar32._12_4_ = -(uint)(auVar65._12_4_ < auVar23._12_4_);
                uVar6 = movmskps((int)context,auVar32);
                context = (RayQueryContext *)(ulong)uVar6;
                auVar22 = auVar23;
                if (uVar6 != 0) {
                  *(undefined1 (*) [16])paVar13[-2].v = auVar23;
                  *(undefined1 (*) [16])paVar13[-1].v = auVar65;
                  auVar22 = *(undefined1 (*) [16])(pNVar9 + -2);
                  auVar33._0_8_ = auVar22._8_8_;
                  auVar33._8_4_ = auVar22._0_4_;
                  auVar33._12_4_ = auVar22._4_4_;
                  *(undefined1 (*) [16])(pNVar9 + -2) = auVar33;
                  auVar22 = auVar65;
                  auVar65 = auVar23;
                }
                if (uVar7 != 2) {
                  auVar23 = *(undefined1 (*) [16])paVar13[-3].v;
                  auVar4._4_4_ = -(uint)(auVar23._4_4_ < auVar22._4_4_);
                  auVar4._0_4_ = -(uint)(auVar23._0_4_ < auVar22._0_4_);
                  auVar4._8_4_ = -(uint)(auVar23._8_4_ < auVar22._8_4_);
                  auVar4._12_4_ = -(uint)(auVar23._12_4_ < auVar22._12_4_);
                  uVar6 = movmskps((int)uVar7,auVar4);
                  uVar7 = (ulong)uVar6;
                  if (uVar6 != 0) {
                    *(undefined1 (*) [16])paVar13[-3].v = auVar22;
                    *(undefined1 (*) [16])paVar13[-1].v = auVar23;
                    uVar7 = pNVar9[-3].ptr;
                    context = (RayQueryContext *)pNVar9[-1].ptr;
                    pNVar9[-3].ptr = (size_t)context;
                    pNVar9[-1].ptr = uVar7;
                    auVar23 = auVar22;
                  }
                  auVar38._4_4_ = -(uint)(auVar23._4_4_ < auVar65._4_4_);
                  auVar38._0_4_ = -(uint)(auVar23._0_4_ < auVar65._0_4_);
                  auVar38._8_4_ = -(uint)(auVar23._8_4_ < auVar65._8_4_);
                  auVar38._12_4_ = -(uint)(auVar23._12_4_ < auVar65._12_4_);
                  uVar6 = movmskps((int)uVar7,auVar38);
                  uVar7 = (ulong)uVar6;
                  if (uVar6 != 0) {
                    *(undefined1 (*) [16])paVar13[-3].v = auVar65;
                    *(undefined1 (*) [16])paVar13[-2].v = auVar23;
                    auVar65 = *(undefined1 (*) [16])(pNVar9 + -3);
                    auVar24._0_8_ = auVar65._8_8_;
                    auVar24._8_4_ = auVar65._0_4_;
                    auVar24._12_4_ = auVar65._4_4_;
                    *(undefined1 (*) [16])(pNVar9 + -3) = auVar24;
                  }
                }
              }
            }
            if (pRVar14 == (RayQueryContext *)&DAT_fffffffffffffff8) {
              return;
            }
            valid_leaf.field_0.i[1] = -(uint)(aVar31.v[1] < (float)bi_8.field_0.i[1]);
            valid_leaf.field_0.i[0] = -(uint)(aVar31.v[0] < (float)bi_8.field_0.i[0]);
            valid_leaf.field_0.i[2] = -(uint)(aVar31.v[2] < (float)bi_8.field_0.i[2]);
            valid_leaf.field_0.i[3] = -(uint)(aVar31.v[3] < (float)bi_8.field_0.i[3]);
            uVar6 = movmskps((int)uVar7,(undefined1  [16])valid_leaf.field_0);
            uVar7 = (ulong)uVar6;
            if (uVar6 != 0) {
              lVar8 = (ulong)((uint)pRVar14 & 0xf) - 8;
              if (lVar8 != 0) {
                pRVar14 = (RayQueryContext *)((ulong)pRVar14 & 0xfffffffffffffff0);
                do {
                  context = pRVar14;
                  InstanceIntersectorK<4>::intersect
                            (&valid_leaf,&pre,(RayHitK<4> *)This,(RayQueryContext *)ray,
                             (Primitive *)pRVar14);
                  pRVar14 = (RayQueryContext *)&pRVar14->args;
                  lVar8 = lVar8 + -1;
                } while (lVar8 != 0);
                iVar5 = 0x7f800000;
                iVar72 = 0x7f800000;
                iVar73 = 0x7f800000;
                iVar75 = 0x7f800000;
                uVar7 = extraout_RAX;
                fVar42 = local_1738;
                fVar44 = fStack_1734;
                fVar46 = fStack_1730;
                fVar48 = fStack_172c;
                fVar66 = local_1748;
                fVar69 = fStack_1744;
                fVar96 = fStack_1740;
                fVar97 = fStack_173c;
                fVar76 = local_1718;
                fVar79 = fStack_1714;
                fVar80 = fStack_1710;
                fVar81 = fStack_170c;
                fVar82 = local_1728;
                fVar84 = fStack_1724;
                fVar85 = fStack_1720;
                fVar86 = fStack_171c;
                fVar87 = local_16f8;
                fVar89 = fStack_16f4;
                fVar90 = fStack_16f0;
                fVar91 = fStack_16ec;
                fVar92 = local_1708;
                fVar93 = fStack_1704;
                fVar94 = fStack_1700;
                fVar95 = fStack_16fc;
              }
              bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                             blendvps((undefined1  [16])bi_8.field_0,
                                      *(undefined1 (*) [16])&(This->intersector4_nofilter).name,
                                      (undefined1  [16])valid_leaf.field_0);
            }
          }
LAB_00242626:
          pRVar14 = (RayQueryContext *)pNVar9[-1].ptr;
          pNVar9 = pNVar9 + -1;
        } while (pRVar14 != (RayQueryContext *)0xfffffffffffffff8);
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }